

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

char * __thiscall
spirv_cross::CompilerGLSL::to_storage_qualifiers_glsl(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  bool is_inout;
  uint32_t loc;
  SPIREntryPoint *execution;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  pSVar3 = Compiler::get_entry_point(&this->super_Compiler);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  bVar1 = subpass_input_is_framebuffer_fetch(this,uVar2);
  if (bVar1) {
    this_local = (CompilerGLSL *)0x48ca95;
  }
  else if ((var->storage == StorageClassInput) || (var->storage == StorageClassOutput)) {
    bVar1 = is_legacy(this);
    if ((bVar1) && (pSVar3->model == ExecutionModelVertex)) {
      this_local = (CompilerGLSL *)"varying ";
      if (var->storage == StorageClassInput) {
        this_local = (CompilerGLSL *)"attribute ";
      }
    }
    else {
      bVar1 = is_legacy(this);
      if ((bVar1) && (pSVar3->model == ExecutionModelFragment)) {
        this_local = (CompilerGLSL *)anon_var_dwarf_365953;
      }
      else if ((pSVar3->model == ExecutionModelFragment) && (var->storage == StorageClassOutput)) {
        uVar2 = Compiler::get_decoration
                          (&this->super_Compiler,(ID)(var->super_IVariant).self.id,
                           DecorationLocation);
        bVar1 = location_is_framebuffer_fetch(this,uVar2);
        if (bVar1) {
          this_local = (CompilerGLSL *)anon_var_dwarf_36595f;
        }
        else {
          this_local = (CompilerGLSL *)0x48fee8;
        }
      }
      else {
        this_local = (CompilerGLSL *)0x48fee8;
        if (var->storage == StorageClassInput) {
          this_local = (CompilerGLSL *)"in ";
        }
      }
    }
  }
  else if ((((var->storage == StorageClassUniformConstant) || (var->storage == StorageClassUniform))
           || (var->storage == StorageClassPushConstant)) ||
          (var->storage == StorageClassAtomicCounter)) {
    this_local = (CompilerGLSL *)anon_var_dwarf_159c3d;
  }
  else if (var->storage == StorageClassRayPayloadKHR) {
    this_local = (CompilerGLSL *)"rayPayloadNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"rayPayloadEXT ";
    }
  }
  else if (var->storage == StorageClassIncomingRayPayloadKHR) {
    this_local = (CompilerGLSL *)"rayPayloadInNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"rayPayloadInEXT ";
    }
  }
  else if (var->storage == StorageClassHitAttributeKHR) {
    this_local = (CompilerGLSL *)"hitAttributeNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"hitAttributeEXT ";
    }
  }
  else if (var->storage == StorageClassCallableDataKHR) {
    this_local = (CompilerGLSL *)"callableDataNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"callableDataEXT ";
    }
  }
  else if (var->storage == StorageClassIncomingCallableDataKHR) {
    this_local = (CompilerGLSL *)"callableDataInNV ";
    if ((this->ray_tracing_is_khr & 1U) != 0) {
      this_local = (CompilerGLSL *)"callableDataInEXT ";
    }
  }
  else {
    this_local = (CompilerGLSL *)0x48ca95;
  }
  return (char *)this_local;
}

Assistant:

const char *CompilerGLSL::to_storage_qualifiers_glsl(const SPIRVariable &var)
{
	auto &execution = get_entry_point();

	if (subpass_input_is_framebuffer_fetch(var.self))
		return "";

	if (var.storage == StorageClassInput || var.storage == StorageClassOutput)
	{
		if (is_legacy() && execution.model == ExecutionModelVertex)
			return var.storage == StorageClassInput ? "attribute " : "varying ";
		else if (is_legacy() && execution.model == ExecutionModelFragment)
			return "varying "; // Fragment outputs are renamed so they never hit this case.
		else if (execution.model == ExecutionModelFragment && var.storage == StorageClassOutput)
		{
			uint32_t loc = get_decoration(var.self, DecorationLocation);
			bool is_inout = location_is_framebuffer_fetch(loc);
			if (is_inout)
				return "inout ";
			else
				return "out ";
		}
		else
			return var.storage == StorageClassInput ? "in " : "out ";
	}
	else if (var.storage == StorageClassUniformConstant || var.storage == StorageClassUniform ||
	         var.storage == StorageClassPushConstant || var.storage == StorageClassAtomicCounter)
	{
		return "uniform ";
	}
	else if (var.storage == StorageClassRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadEXT " : "rayPayloadNV ";
	}
	else if (var.storage == StorageClassIncomingRayPayloadKHR)
	{
		return ray_tracing_is_khr ? "rayPayloadInEXT " : "rayPayloadInNV ";
	}
	else if (var.storage == StorageClassHitAttributeKHR)
	{
		return ray_tracing_is_khr ? "hitAttributeEXT " : "hitAttributeNV ";
	}
	else if (var.storage == StorageClassCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataEXT " : "callableDataNV ";
	}
	else if (var.storage == StorageClassIncomingCallableDataKHR)
	{
		return ray_tracing_is_khr ? "callableDataInEXT " : "callableDataInNV ";
	}

	return "";
}